

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_on_fork(void)

{
  uint8_t uVar1;
  uint uVar2;
  ulong uStack_18;
  uint16_t old_active;
  size_t i;
  size_t limit;
  
  fio_timer_lock = '\0';
  fio_data->lock = '\0';
  fio_defer_on_fork();
  fio_malloc_after_fork();
  fio_poll_init();
  fio_state_callback_on_fork();
  uVar2 = fio_data->capa;
  for (uStack_18 = 0; uStack_18 < uVar2; uStack_18 = uStack_18 + 1) {
    *(undefined1 *)((long)fio_data + uStack_18 * 0xa8 + 0x6e) = 0;
    *(undefined1 *)((long)fio_data + uStack_18 * 0xa8 + 0x6c) = 0;
    if (*(long *)((long)fio_data + uStack_18 * 0xa8 + 0x58) != 0) {
      *(undefined8 *)(*(long *)((long)fio_data + uStack_18 * 0xa8 + 0x58) + 0x28) = 0;
      fio_force_close(uStack_18 << 8 | (ulong)*(byte *)((long)fio_data + uStack_18 * 0xa8 + 0x6d));
    }
  }
  fio_pubsub_on_fork();
  fio_max_fd_shrink();
  uVar1 = fio_data->active;
  fio_data->active = '\0';
  fio_defer_perform();
  fio_data->active = uVar1;
  fio_data->is_worker = '\x01';
  return;
}

Assistant:

static void fio_on_fork(void) {
  fio_timer_lock = FIO_LOCK_INIT;
  fio_data->lock = FIO_LOCK_INIT;
  fio_defer_on_fork();
  fio_malloc_after_fork();
  fio_poll_init();
  fio_state_callback_on_fork();

  const size_t limit = fio_data->capa;
  for (size_t i = 0; i < limit; ++i) {
    fd_data(i).sock_lock = FIO_LOCK_INIT;
    fd_data(i).protocol_lock = FIO_LOCK_INIT;
    if (fd_data(i).protocol) {
      fd_data(i).protocol->rsv = 0;
      fio_force_close(fd2uuid(i));
    }
  }

  fio_pubsub_on_fork();
  fio_max_fd_shrink();
  uint16_t old_active = fio_data->active;
  fio_data->active = 0;
  fio_defer_perform();
  fio_data->active = old_active;
  fio_data->is_worker = 1;
}